

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_cond_move(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGTemp *pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 ret;
  TCGOpcode TVar4;
  TCGCond cond;
  TCGContext_conflict6 *tcg_ctx;
  uintptr_t o_2;
  TCGv_i64 v1;
  uintptr_t o_3;
  TCGv_i64 c1;
  
  if (rd == 0) {
    return;
  }
  pTVar1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
  c1 = (TCGv_i64)((long)pTVar1 - (long)ctx);
  if (rt == 0) {
    TVar4 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_0098ab88:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar2);
  }
  else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2) != c1) {
    pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2) + (long)ctx;
    TVar4 = INDEX_op_mov_i64;
    goto LAB_0098ab88;
  }
  pTVar2 = tcg_const_i64_mips64el((TCGContext_conflict6 *)ctx,0);
  pTVar1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
  v1 = (TCGv_i64)((long)pTVar1 - (long)ctx);
  if (rs == 0) {
    TVar4 = INDEX_op_movi_i64;
    pTVar3 = (TCGv_i64)0x0;
LAB_0098abe0:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar3);
  }
  else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) != v1) {
    pTVar3 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) + (long)ctx;
    TVar4 = INDEX_op_mov_i64;
    goto LAB_0098abe0;
  }
  if ((int)opc < 0x35) {
    if (opc != 10) {
      if (opc != 0xb) goto LAB_0098ac67;
      ret = *(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2);
      pTVar3 = ret;
      goto LAB_0098ac25;
    }
    ret = *(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2);
    pTVar3 = ret;
LAB_0098ac51:
    cond = TCG_COND_EQ;
  }
  else {
    pTVar3 = pTVar2;
    if (opc == 0x35) {
      ret = *(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2);
      goto LAB_0098ac51;
    }
    if (opc != 0x37) goto LAB_0098ac67;
    ret = *(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2);
LAB_0098ac25:
    cond = TCG_COND_NE;
  }
  tcg_gen_movcond_i64_mips64el((TCGContext_conflict6 *)ctx,cond,ret,c1,pTVar2,v1,pTVar3);
LAB_0098ac67:
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(v1 + (long)ctx));
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(pTVar2 + (long)ctx));
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(c1 + (long)ctx));
  return;
}

Assistant:

static void gen_cond_move(DisasContext *ctx, uint32_t opc,
                          int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1, t2;

    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rt);
    t1 = tcg_const_tl(tcg_ctx, 0);
    t2 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t2, rs);
    switch (opc) {
    case OPC_MOVN:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_gpr[rd], t0, t1, t2, tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_MOVZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_gpr[rd], t0, t1, t2, tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_SELNEZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_gpr[rd], t0, t1, t2, t1);
        break;
    case OPC_SELEQZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_gpr[rd], t0, t1, t2, t1);
        break;
    }
    tcg_temp_free(tcg_ctx, t2);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);
}